

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *args_2;
  HierarchicalInstanceSyntax *pHVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  InstanceNameSyntax *local_40;
  Token local_38;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_40 = (InstanceNameSyntax *)0x0;
  }
  else {
    local_40 = (InstanceNameSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::PortConnectionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)(__fn + 0x30),
                      (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  pHVar1 = BumpAllocator::
           emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,args_2,&local_38);
  return (int)pHVar1;
}

Assistant:

static SyntaxNode* clone(const HierarchicalInstanceSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<HierarchicalInstanceSyntax>(
        node.decl ? deepClone(*node.decl, alloc) : nullptr,
        node.openParen.deepClone(alloc),
        *deepClone(node.connections, alloc),
        node.closeParen.deepClone(alloc)
    );
}